

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O0

llb_build_key_t * llb_build_key_make_custom_task_with_data(char *name,llb_data_t data)

{
  CAPIBuildKey *this;
  StringRef local_88;
  StringRef local_78;
  BuildKey local_68;
  uint8_t *local_48;
  char *name_local;
  llb_data_t data_local;
  
  data_local.length = (uint64_t)data.data;
  name_local = (char *)data.length;
  local_48 = (uint8_t *)name;
  this = (CAPIBuildKey *)operator_new(0x38);
  data_local.data = local_48;
  local_78.Data = (char *)local_48;
  if (local_48 != (uint8_t *)0x0) {
    strlen((char *)local_48);
  }
  local_88.Data = (char *)data_local.length;
  local_88.Length = (size_t)name_local;
  llbuild::buildsystem::BuildKey::makeCustomTask(&local_68,local_78,local_88);
  anon_unknown.dwarf_1e10c2::CAPIBuildKey::CAPIBuildKey(this,&local_68);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_68);
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make_custom_task_with_data(const char *name, llb_data_t data) {
  return (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeCustomTask(StringRef(name), StringRef((const char *)data.data, data.length)));
}